

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
UntypedPerformAction
          (FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestFunction> *pAVar1;
  Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> action;
  linked_ptr<testing::ActionInterface<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>_>
  local_20;
  
  linked_ptr<testing::ActionInterface<TestFunction(int,fmt::BasicStringRef<char>,int,mp::func::Type)>>
  ::copy<testing::ActionInterface<TestFunction(int,fmt::BasicStringRef<char>,int,mp::func::Type)>>
            ((linked_ptr<testing::ActionInterface<TestFunction(int,fmt::BasicStringRef<char>,int,mp::func::Type)>>
              *)&local_20,
             (linked_ptr<testing::ActionInterface<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>_>
              *)untyped_action);
  pAVar1 = ActionResultHolder<TestFunction>::
           PerformAction<TestFunction(int,fmt::BasicStringRef<char>,int,mp::func::Type)>
                     ((Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)
                      &local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>_>
  ::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }